

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader.h
# Opt level: O1

void __thiscall
hiberlite::LoadBean::act<hiberlite::AVisitor<hiberlite::LoadBean>,double>
          (LoadBean *this,AVisitor<hiberlite::LoadBean> *av,db_atom<double> *atom)

{
  pointer pcVar1;
  int iCol;
  _Elt_pointer ppVar2;
  double dVar3;
  string local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  int local_38;
  
  pcVar1 = (av->scope)._table._M_dataplus._M_p;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + (av->scope)._table._M_string_length);
  pcVar1 = (av->scope)._prefix._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (av->scope)._prefix._M_string_length);
  local_38 = (av->scope).prefix_depth;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_58,local_58 + local_50);
  iCol = locateCol(this,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  ppVar2 = (this->stmt).c.
           super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar2 == (this->stmt).c.
                super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppVar2 = (this->stmt).c.
             super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
  }
  dVar3 = SQLiteSelect::get_double(&ppVar2[-1].first,iCol);
  *atom->val = dVar3;
  return;
}

Assistant:

inline void act(AV& av, db_atom<C> atom){
			int col_indx=locateCol(av.getScope().prefix());
			atom.loadValue(stmt.top().first, col_indx);
		}